

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(ON_SubDEdgeSharpness *a,ON_SubDEdgeSharpness *b)

{
  float fVar1;
  bool bVar2;
  int local_40;
  float x;
  int i;
  int count;
  float s [4];
  ON_SubDEdgeSharpness *b_local;
  ON_SubDEdgeSharpness *a_local;
  ON_SubDEdgeSharpness u;
  
  memset(&i,0,0x10);
  x = 0.0;
  bVar2 = IsSharp(a);
  if (bVar2) {
    i = (int)a->m_edge_sharpness[0];
    count = (int)a->m_edge_sharpness[1];
    x = 2.8026e-45;
  }
  bVar2 = IsSharp(b);
  if (bVar2) {
    (&i)[(int)x] = (int)b->m_edge_sharpness[0];
    (&i)[(int)x + 1] = (int)b->m_edge_sharpness[1];
    x = (float)((int)x + 2);
  }
  a_local = (ON_SubDEdgeSharpness *)FromConstant((double)(float)i);
  for (local_40 = 1; local_40 < (int)x; local_40 = local_40 + 1) {
    fVar1 = (float)(&i)[local_40];
    if (a_local._0_4_ <= fVar1) {
      if (a_local._4_4_ < fVar1) {
        a_local = (ON_SubDEdgeSharpness *)CONCAT44(fVar1,a_local._0_4_);
      }
    }
    else {
      a_local = (ON_SubDEdgeSharpness *)CONCAT44(a_local._4_4_,fVar1);
    }
  }
  return (ON_SubDEdgeSharpness)(float  [2])a_local;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(
  const ON_SubDEdgeSharpness& a,
  const ON_SubDEdgeSharpness& b
)
{
  float s[4] = {};
  int count = 0;

  if (a.IsSharp())
  {
    s[0] = a.m_edge_sharpness[0];
    s[1] = a.m_edge_sharpness[1];
    count = 2;
  }
  if (b.IsSharp())
  {
    s[count] = b.m_edge_sharpness[0];
    s[count+1] = b.m_edge_sharpness[1];
    count += 2;
  }
  ON_SubDEdgeSharpness u = ON_SubDEdgeSharpness::FromConstant(s[0]);
  for ( int i = 1; i < count; ++i)
  { 
    float x = s[i];
    if (x < u.m_edge_sharpness[0])
      u.m_edge_sharpness[0] = x;
    else if (x > u.m_edge_sharpness[1])
      u.m_edge_sharpness[1] = x;
  }
  return u;
}